

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

bool __thiscall
NULLCMemory::check_access
          (NULLCMemory *this,NULLCArray buffer,int offset,uint readSizeLog2,int elements)

{
  uint uVar1;
  uint uVar2;
  char *error;
  
  uVar1 = buffer.len;
  if (this == (NULLCMemory *)0x0) {
    error = "buffer is empty";
  }
  else if ((int)uVar1 < 0) {
    error = "offset is negative";
  }
  else if ((int)readSizeLog2 < 0) {
    error = "element count is negative";
  }
  else {
    error = "buffer overflow";
    uVar2 = (uint)buffer.ptr - uVar1;
    if ((uVar1 <= (uint)buffer.ptr && uVar2 != 0) &&
       (readSizeLog2 <= uVar2 >> ((byte)offset & 0x1f))) {
      return true;
    }
  }
  nullcThrowError(error);
  return false;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}